

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  bool bVar1;
  int width;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  int local_294;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  tm time_struct;
  string local_38;
  
  width = 1000;
  bVar1 = PortableLocaltime((long)this / 1000,&time_struct);
  if (bVar1) {
    local_294 = time_struct.tm_year + 0x76c;
    StreamableToString<int>(&local_38,&local_294);
    std::operator+(&local_1b0,&local_38,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_1d0,(String *)(ulong)(time_struct.tm_mon + 1),value);
    std::operator+(&local_190,&local_1b0,&local_1d0);
    std::operator+(&local_170,&local_190,"-");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1f0,(String *)(ulong)(uint)time_struct.tm_mday,value_00);
    std::operator+(&local_150,&local_170,&local_1f0);
    std::operator+(&local_130,&local_150,"T");
    String::FormatIntWidth2_abi_cxx11_
              (&local_210,(String *)(ulong)(uint)time_struct.tm_hour,value_01);
    std::operator+(&local_110,&local_130,&local_210);
    std::operator+(&local_f0,&local_110,":");
    String::FormatIntWidth2_abi_cxx11_
              (&local_230,(String *)(ulong)(uint)time_struct.tm_min,value_02);
    std::operator+(&local_d0,&local_f0,&local_230);
    std::operator+(&local_b0,&local_d0,":");
    String::FormatIntWidth2_abi_cxx11_
              (&local_250,(String *)(ulong)(uint)time_struct.tm_sec,value_03);
    std::operator+(&local_90,&local_b0,&local_250);
    std::operator+(&local_290,&local_90,".");
    String::FormatIntWidthN_abi_cxx11_
              (&local_270,(String *)((long)this % 1000 & 0xffffffff),3,width);
    std::operator+(__return_storage_ptr__,&local_290,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_290);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss.sss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
         String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
         String::FormatIntWidth2(time_struct.tm_mday) + "T" +
         String::FormatIntWidth2(time_struct.tm_hour) + ":" +
         String::FormatIntWidth2(time_struct.tm_min) + ":" +
         String::FormatIntWidth2(time_struct.tm_sec) + "." +
         String::FormatIntWidthN(static_cast<int>(ms % 1000), 3);
}